

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

Pos getLinkedGatewayChunk(EndNoise *en,SurfaceNoise *sn,uint64_t seed,Pos src,Pos *dst)

{
  int iVar1;
  int iVar2;
  uint chunkZ;
  uint chunkX;
  uint chunkX_00;
  uint chunkZ_00;
  bool bVar4;
  double dVar5;
  double dVar6;
  Pos PVar7;
  double dVar8;
  double dVar9;
  double local_68;
  double dStack_60;
  ulong uVar3;
  
  iVar1 = src.x;
  iVar2 = src.z;
  dVar8 = 1.0 / SQRT((double)(iVar2 * iVar2 + iVar1 * iVar1));
  dVar9 = dVar8 * (double)iVar1;
  dVar8 = dVar8 * (double)iVar2;
  local_68 = dVar9 * 1024.0;
  dStack_60 = dVar8 * 1024.0;
  dVar9 = dVar9 * 16.0;
  dVar8 = dVar8 * 16.0;
  dVar5 = floor(local_68);
  chunkX_00 = (int)dVar5 >> 4;
  dVar5 = floor(dStack_60);
  chunkZ_00 = (int)dVar5 >> 4;
  iVar1 = isEndChunkEmpty(en,sn,seed,chunkX_00,chunkZ_00);
  if (iVar1 == 0) {
    iVar1 = 0x10;
    do {
      chunkX = chunkX_00;
      uVar3 = (ulong)chunkZ_00;
      iVar1 = iVar1 + -1;
      if (iVar1 == 0) break;
      local_68 = local_68 - dVar9;
      dStack_60 = dStack_60 - dVar8;
      dVar5 = floor(local_68);
      dVar6 = floor(dStack_60);
      chunkZ_00 = (int)dVar6 >> 4;
      iVar2 = isEndChunkEmpty(en,sn,seed,(int)dVar5 >> 4,chunkZ_00);
      chunkX_00 = (int)dVar5 >> 4;
    } while (iVar2 == 0);
  }
  else {
    iVar1 = 0xf;
    do {
      bVar4 = iVar1 == 0;
      iVar1 = iVar1 + -1;
      if (bVar4) {
        uVar3 = (ulong)chunkZ_00;
        chunkX = chunkX_00;
        break;
      }
      local_68 = local_68 + dVar9;
      dStack_60 = dStack_60 + dVar8;
      dVar5 = floor(local_68);
      chunkX = (int)dVar5 >> 4;
      dVar5 = floor(dStack_60);
      chunkZ = (int)dVar5 >> 4;
      uVar3 = (ulong)chunkZ;
    } while (((chunkX == chunkX_00) && (chunkZ == chunkZ_00)) ||
            (iVar2 = isEndChunkEmpty(en,sn,seed,chunkX,chunkZ), chunkX_00 = chunkX,
            chunkZ_00 = chunkZ, iVar2 != 0));
  }
  if (dst != (Pos *)0x0) {
    dVar5 = floor(local_68);
    dVar8 = floor(dStack_60);
    PVar7.x = (int)dVar5;
    PVar7.z = (int)dVar8;
    *dst = PVar7;
  }
  return (Pos)((ulong)chunkX | uVar3 << 0x20);
}

Assistant:

Pos getLinkedGatewayChunk(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    Pos src, Pos *dst)
{
    double invr = 1.0 / sqrt(src.x * src.x + src.z * src.z);
    double dx = src.x * invr;
    double dz = src.z * invr;
    double px = dx * 1024;
    double pz = dz * 1024;
    dx *= 16;
    dz *= 16;

    int i;
    Pos c;
    c.x = (int) floor(px) >> 4;
    c.z = (int) floor(pz) >> 4;

    if (isEndChunkEmpty(en, sn, seed, c.x, c.z))
    {   // look forward for the first non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px += dx) >> 4;
            int qz = (int) floor(pz += dz) >> 4;
            if (qx == c.x && qz == c.z)
                continue;
            c.x = qx;
            c.z = qz;
            if (!isEndChunkEmpty(en, sn, seed, c.x, c.z))
                break;
        }
    }
    else
    {   // look backward for the last non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px -= dx) >> 4;
            int qz = (int) floor(pz -= dz) >> 4;
            if (isEndChunkEmpty(en, sn, seed, qx, qz))
                break;
            c.x = qx;
            c.z = qz;
        }
    }
    if (dst)
    {
        dst->x = (int) floor(px);
        dst->z = (int) floor(pz);
    }
    return c;
}